

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

object_t * __thiscall
acto::core::runtime_t::create_actor
          (runtime_t *this,unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *body,
          actor_thread thread_opt)

{
  worker_t *this_00;
  actor_thread thread_opt_00;
  object_t *poVar1;
  long lVar2;
  pair<std::__detail::_Node_iterator<acto::core::object_t_*,_true,_false>,_bool> pVar3;
  int local_84;
  duration<long,_std::ratio<1L,_1000L>_> local_80;
  duration local_78;
  worker_t *local_70;
  worker_t *worker;
  undefined1 local_60;
  lock_guard<std::mutex> local_58;
  lock_guard<std::mutex> g;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> local_30;
  object_t *local_28;
  object_t *result;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *puStack_18;
  actor_thread thread_opt_local;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *body_local;
  runtime_t *this_local;
  
  result._4_4_ = thread_opt;
  puStack_18 = body;
  body_local = (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)this;
  poVar1 = (object_t *)operator_new(0x68);
  thread_opt_00 = result._4_4_;
  std::unique_ptr<acto::actor,_std::default_delete<acto::actor>_>::unique_ptr(&local_30,body);
  object_t::object_t(poVar1,thread_opt_00,&local_30);
  std::unique_ptr<acto::actor,_std::default_delete<acto::actor>_>::~unique_ptr(&local_30);
  local_28 = poVar1;
  if ((result._4_4_ == bind) &&
     (lVar2 = (anonymous)::thread_context(), (*(byte *)(lVar2 + 0x40) & 1) == 0)) {
    std::__atomic_base<unsigned_long>::operator+=
              (&(local_28->references).super___atomic_base<unsigned_long>,1);
    lVar2 = (anonymous)::thread_context();
    std::
    unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
    ::insert((unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
              *)(lVar2 + 8),&local_28);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&local_58,&this->mutex_);
    pVar3 = std::
            unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
            ::insert(&this->actors_,&local_28);
    worker = (worker_t *)pVar3.first.super__Node_iterator_base<acto::core::object_t_*,_false>._M_cur
    ;
    local_60 = pVar3.second;
    event::reset(&this->no_actors_event_);
    std::lock_guard<std::mutex>::~lock_guard(&local_58);
    if (result._4_4_ == exclusive) {
      local_70 = create_worker(this);
      local_28->field_0x60 = local_28->field_0x60 & 0xf7 | 8;
      local_28->thread = local_70;
      std::__atomic_base<unsigned_long>::operator++
                (&(this->workers_).reserved.super___atomic_base<unsigned_long>);
      poVar1 = local_28;
      this_00 = local_70;
      local_84 = 500;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&local_80,&local_84);
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_78,&local_80);
      worker_t::assign(this_00,poVar1,local_78);
    }
  }
  return local_28;
}

Assistant:

object_t* runtime_t::create_actor(std::unique_ptr<actor> body,
                                  const actor_thread thread_opt) {
  object_t* const result = new core::object_t(thread_opt, std::move(body));
  // Bind actor to the current thread if the thread did not created by the
  // library.
  if (thread_opt == actor_thread::bind && !thread_context.is_worker_thread) {
    result->references += 1;
    thread_context.actors.insert(result);
  } else {
    {
      std::lock_guard<std::mutex> g(mutex_);

      actors_.insert(result);

      no_actors_event_.reset();
    }
    // Create dedicated thread for the actor if necessary.
    if (thread_opt == actor_thread::exclusive) {
      worker_t* const worker = create_worker();

      result->scheduled = true;
      result->thread = worker;

      ++workers_.reserved;

      worker->assign(result, std::chrono::milliseconds(500));
    }
  }

  return result;
}